

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

attributes_t * __thiscall
tchecker::parsing::system::parser_t::value_type::as<tchecker::parsing::attributes_t>
          (value_type *this)

{
  bool bVar1;
  attributes_t *paVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x14f,
                  "const T &tchecker::parsing::system::parser_t::value_type::as() const [T = tchecker::parsing::attributes_t]"
                 );
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&attributes_t::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x150,
                  "const T &tchecker::parsing::system::parser_t::value_type::as() const [T = tchecker::parsing::attributes_t]"
                 );
  }
  paVar2 = yyas_<tchecker::parsing::attributes_t>(this);
  return paVar2;
}

Assistant:

const T&
    as () const YY_NOEXCEPT
    {
      SPYY_ASSERT (yytypeid_);
      SPYY_ASSERT (*yytypeid_ == typeid (T));
      SPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }